

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_read_write_null_arguments(void)

{
  int iVar1;
  uv_buf_t uVar2;
  
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
  if (iVar1 == -0x16) {
    uv_fs_req_cleanup(&read_req);
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
    if (iVar1 != -0x16) goto LAB_00156e37;
    if (write_req.path != (char *)0x0) goto LAB_00156e3c;
    if (write_req.ptr != (void *)0x0) goto LAB_00156e41;
    if (write_req.new_path != (char *)0x0) goto LAB_00156e46;
    if (write_req.bufs != (uv_buf_t *)0x0) goto LAB_00156e4b;
    uv_fs_req_cleanup(&write_req);
    iov = uv_buf_init((char *)0x0,0);
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,0,&iov,0,-1,(uv_fs_cb)0x0);
    if (iVar1 != -0x16) goto LAB_00156e50;
    uv_fs_req_cleanup(&read_req);
    uVar2 = uv_buf_init((char *)0x0,0);
    iov = uVar2;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,0,&iov,0,-1,(uv_fs_cb)0x0);
    if (iVar1 != -0x16) goto LAB_00156e55;
    uv_fs_req_cleanup(&write_req);
    loop = uv_default_loop();
    iVar1 = uv_fs_read(loop,&read_req,0,(uv_buf_t *)0x0,0,-1,fail_cb);
    if (iVar1 != -0x16) goto LAB_00156e5a;
    uv_run(loop,UV_RUN_DEFAULT);
    uv_fs_req_cleanup(&read_req);
    iVar1 = uv_fs_write(loop,&write_req,0,(uv_buf_t *)0x0,0,-1,fail_cb);
    if (iVar1 != -0x16) goto LAB_00156e5f;
    uv_run(loop,UV_RUN_DEFAULT);
    uv_fs_req_cleanup(&write_req);
    uVar2 = uv_buf_init((char *)0x0,0);
    iov = uVar2;
    iVar1 = uv_fs_read(loop,&read_req,0,&iov,0,-1,fail_cb);
    if (iVar1 == -0x16) {
      uv_run(loop,UV_RUN_DEFAULT);
      uv_fs_req_cleanup(&read_req);
      uVar2 = uv_buf_init((char *)0x0,0);
      iov = uVar2;
      iVar1 = uv_fs_write(loop,&write_req,0,&iov,0,-1,fail_cb);
      if (iVar1 == -0x16) {
        uv_run(loop,UV_RUN_DEFAULT);
        uv_fs_req_cleanup(&write_req);
        return 0;
      }
      goto LAB_00156e69;
    }
  }
  else {
    run_test_fs_read_write_null_arguments_cold_1();
LAB_00156e37:
    run_test_fs_read_write_null_arguments_cold_2();
LAB_00156e3c:
    run_test_fs_read_write_null_arguments_cold_3();
LAB_00156e41:
    run_test_fs_read_write_null_arguments_cold_4();
LAB_00156e46:
    run_test_fs_read_write_null_arguments_cold_5();
LAB_00156e4b:
    run_test_fs_read_write_null_arguments_cold_6();
LAB_00156e50:
    run_test_fs_read_write_null_arguments_cold_7();
LAB_00156e55:
    run_test_fs_read_write_null_arguments_cold_8();
LAB_00156e5a:
    run_test_fs_read_write_null_arguments_cold_9();
LAB_00156e5f:
    run_test_fs_read_write_null_arguments_cold_10();
  }
  run_test_fs_read_write_null_arguments_cold_11();
LAB_00156e69:
  run_test_fs_read_write_null_arguments_cold_12();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,0x193,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_read_write_null_arguments) {
  int r;

  r = uv_fs_read(NULL, &read_req, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(NULL, &write_req, 0, NULL, 0, -1, NULL);
  /* Validate some memory management on failed input validation before sending
     fs work to the thread pool. */
  ASSERT(r == UV_EINVAL);
  ASSERT(write_req.path == NULL);
  ASSERT(write_req.ptr == NULL);
#ifdef _WIN32
  ASSERT(write_req.file.pathw == NULL);
  ASSERT(write_req.fs.info.new_pathw == NULL);
  ASSERT(write_req.fs.info.bufs == NULL);
#else
  ASSERT(write_req.new_path == NULL);
  ASSERT(write_req.bufs == NULL);
#endif
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(NULL, &read_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(NULL, &write_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&write_req);

  /* If the arguments are invalid, the loop should not be kept open */
  loop = uv_default_loop();

  r = uv_fs_read(loop, &read_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(loop, &write_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(loop, &read_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(loop, &write_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  return 0;
}